

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipTimer.h
# Opt level: O1

void __thiscall MipTimer::initialiseMipClocks(MipTimer *this,HighsTimerClock *mip_timer_clock)

{
  HighsTimer *this_00;
  HighsInt HVar1;
  
  this_00 = mip_timer_clock->timer_pointer_;
  std::vector<int,_std::allocator<int>_>::resize(&mip_timer_clock->clock_,0x3e);
  *(mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  HVar1 = HighsTimer::clock_def(this_00,"MIP presolve");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[1] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"MIP solve");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[2] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"MIP postsolve");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[3] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Solve LP - simplex basis");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x39] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Solve LP - simplex no basis");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x3a] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Solve LP: IPM");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x3b] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Initialise");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[4] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Run presolve");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[5] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Run setup");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[6] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Trivial heuristics");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[7] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Evaluate root node");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[8] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Perform aging 0");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[9] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Search");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[10] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Start symmetry detection");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"A-centre - start");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Evaluate root LP");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Separate LP cuts");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Randomized rounding");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Perform restart");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Root separation");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"A-centre - finish");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Root central rounding");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Root separation round 0");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Root heuristics reduced cost");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Root separation round 1");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Root heuristics RENS");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Root separation round 2");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x20] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Root feasibility pump");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x21] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Root separation round 3");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x22] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"kMipClockEvaluateRootNode0");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x23] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"kMipClockEvaluateRootNode1");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x24] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"kMipClockEvaluateRootNode2");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x25] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Separation");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x35] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"A-centre - finish");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x36] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Central rounding");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x37] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Evaluate root LP");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x38] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Probing - presolve");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Perform aging 1");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Dive");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Open nodes to queue 0");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Domain propagate");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Prune infeasible nodes");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Update local domain");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Node search");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Evaluate node");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x26] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Dive primal heuristics");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x27] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"The dive");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x28] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Backtrack plunge");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x29] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Perform aging 2");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x2a] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Dive Randomized rounding");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x2b] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Dive RENS");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x2c] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Dive RINS");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x2d] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Current node to queue");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x2e] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Search backtrack");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x2f] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Pruned loop search");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x30] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Open nodes to queue 1");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x31] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Evaluate node 1");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x32] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Node search separation");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x33] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Store basis");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x34] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Sub-MIP solves");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x3c] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"Probing - implications");
  (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x3d] = HVar1;
  return;
}

Assistant:

void initialiseMipClocks(HighsTimerClock& mip_timer_clock) {
    HighsTimer* timer_pointer = mip_timer_clock.timer_pointer_;
    std::vector<HighsInt>& clock = mip_timer_clock.clock_;
    clock.resize(kNumMipClock);
    clock[kMipClockTotal] = 0;
    clock[kMipClockPresolve] = timer_pointer->clock_def("MIP presolve");
    clock[kMipClockSolve] = timer_pointer->clock_def("MIP solve");
    clock[kMipClockPostsolve] = timer_pointer->clock_def("MIP postsolve");

    // Sometimes the analytic centre clock isn't stopped - because it
    // runs on a separate thread. Although it would be good to
    // understand this better, for now don't assert that this clock
    // has stopped in HighsTimer.h. This is done with a hard-coded
    // clock ID that needs to equal clock[kMipClockIpmSolveLp]
    //
    // Define the clocks for evaluating the LPs first, so that
    // clock[kMipClockIpmSolveLp] isn't changed by inserting new
    // clocks
    clock[kMipClockSimplexBasisSolveLp] =
        timer_pointer->clock_def("Solve LP - simplex basis");
    clock[kMipClockSimplexNoBasisSolveLp] =
        timer_pointer->clock_def("Solve LP - simplex no basis");
    clock[kMipClockIpmSolveLp] = timer_pointer->clock_def("Solve LP: IPM");
    assert(clock[kMipClockIpmSolveLp] == 9);

    // Level 1 - Should correspond to kMipClockTotal
    clock[kMipClockInit] = timer_pointer->clock_def("Initialise");
    clock[kMipClockRunPresolve] = timer_pointer->clock_def("Run presolve");
    clock[kMipClockRunSetup] = timer_pointer->clock_def("Run setup");
    clock[kMipClockTrivialHeuristics] =
        timer_pointer->clock_def("Trivial heuristics");
    clock[kMipClockEvaluateRootNode] =
        timer_pointer->clock_def("Evaluate root node");
    clock[kMipClockPerformAging0] = timer_pointer->clock_def("Perform aging 0");
    clock[kMipClockSearch] = timer_pointer->clock_def("Search");
    // kMipClockPostsolve

    // Evaluate root node
    clock[kMipClockStartSymmetryDetection] =
        timer_pointer->clock_def("Start symmetry detection");
    clock[kMipClockStartAnalyticCentreComputation] =
        timer_pointer->clock_def("A-centre - start");
    clock[kMipClockEvaluateRootLp] =
        timer_pointer->clock_def("Evaluate root LP");
    clock[kMipClockSeparateLpCuts] =
        timer_pointer->clock_def("Separate LP cuts");
    clock[kMipClockRandomizedRounding] =
        timer_pointer->clock_def("Randomized rounding");
    clock[kMipClockPerformRestart] =
        timer_pointer->clock_def("Perform restart");
    clock[kMipClockRootSeparation] =
        timer_pointer->clock_def("Root separation");
    clock[kMipClockFinishAnalyticCentreComputation] =
        timer_pointer->clock_def("A-centre - finish");
    clock[kMipClockRootCentralRounding] =
        timer_pointer->clock_def("Root central rounding");
    clock[kMipClockRootSeparationRound0] =
        timer_pointer->clock_def("Root separation round 0");
    clock[kMipClockRootHeuristicsReducedCost] =
        timer_pointer->clock_def("Root heuristics reduced cost");
    clock[kMipClockRootSeparationRound1] =
        timer_pointer->clock_def("Root separation round 1");
    clock[kMipClockRootHeuristicsRens] =
        timer_pointer->clock_def("Root heuristics RENS");
    clock[kMipClockRootSeparationRound2] =
        timer_pointer->clock_def("Root separation round 2");
    clock[kMipClockRootFeasibilityPump] =
        timer_pointer->clock_def("Root feasibility pump");
    clock[kMipClockRootSeparationRound3] =
        timer_pointer->clock_def("Root separation round 3");
    //    clock[kMipClock@] = timer_pointer->clock_def("@");

    clock[kMipClockEvaluateRootNode0] =
        timer_pointer->clock_def("kMipClockEvaluateRootNode0");
    clock[kMipClockEvaluateRootNode1] =
        timer_pointer->clock_def("kMipClockEvaluateRootNode1");
    clock[kMipClockEvaluateRootNode2] =
        timer_pointer->clock_def("kMipClockEvaluateRootNode2");

    // Separation
    clock[kMipClockRootSeparationRound] =
        timer_pointer->clock_def("Separation");
    clock[kMipClockRootSeparationFinishAnalyticCentreComputation] =
        timer_pointer->clock_def("A-centre - finish");
    clock[kMipClockRootSeparationCentralRounding] =
        timer_pointer->clock_def("Central rounding");
    clock[kMipClockRootSeparationEvaluateRootLp] =
        timer_pointer->clock_def("Evaluate root LP");

    // Presolve - Should correspond to kMipClockRunPresolve
    clock[kMipClockProbingPresolve] =
        timer_pointer->clock_def("Probing - presolve");

    // Search - Should correspond to kMipClockSearch
    clock[kMipClockPerformAging1] = timer_pointer->clock_def("Perform aging 1");
    clock[kMipClockDive] = timer_pointer->clock_def("Dive");
    clock[kMipClockOpenNodesToQueue0] =
        timer_pointer->clock_def("Open nodes to queue 0");
    clock[kMipClockDomainPropgate] =
        timer_pointer->clock_def("Domain propagate");
    clock[kMipClockPruneInfeasibleNodes] =
        timer_pointer->clock_def("Prune infeasible nodes");
    clock[kMipClockUpdateLocalDomain] =
        timer_pointer->clock_def("Update local domain");
    clock[kMipClockNodeSearch] = timer_pointer->clock_def("Node search");
    //    clock[kMipClock@] = timer_pointer->clock_def("@");

    // Dive - Should correspond to kMipClockDive
    clock[kMipClockDiveEvaluateNode] =
        timer_pointer->clock_def("Evaluate node");
    clock[kMipClockDivePrimalHeuristics] =
        timer_pointer->clock_def("Dive primal heuristics");
    clock[kMipClockTheDive] = timer_pointer->clock_def("The dive");
    clock[kMipClockBacktrackPlunge] =
        timer_pointer->clock_def("Backtrack plunge");
    clock[kMipClockPerformAging2] = timer_pointer->clock_def("Perform aging 2");

    // Primal heuristics - Should correspond to kMipDiveClockPrimalHeuristics
    clock[kMipClockDiveRandomizedRounding] =
        timer_pointer->clock_def("Dive Randomized rounding");
    clock[kMipClockDiveRens] = timer_pointer->clock_def("Dive RENS");
    clock[kMipClockDiveRins] = timer_pointer->clock_def("Dive RINS");

    // Node search
    clock[kMipClockCurrentNodeToQueue] =
        timer_pointer->clock_def("Current node to queue");
    clock[kMipClockSearchBacktrack] =
        timer_pointer->clock_def("Search backtrack");
    clock[kMipClockNodePrunedLoop] =
        timer_pointer->clock_def("Pruned loop search");
    clock[kMipClockOpenNodesToQueue1] =
        timer_pointer->clock_def("Open nodes to queue 1");
    clock[kMipClockEvaluateNode1] = timer_pointer->clock_def("Evaluate node 1");
    clock[kMipClockNodeSearchSeparation] =
        timer_pointer->clock_def("Node search separation");
    clock[kMipClockStoreBasis] = timer_pointer->clock_def("Store basis");
    //    clock[] = timer_pointer->clock_def("");

    // Sub-MIP clock
    clock[kMipClockSubMipSolve] = timer_pointer->clock_def("Sub-MIP solves");

    clock[kMipClockProbingImplications] =
        timer_pointer->clock_def("Probing - implications");
    //    clock[] = timer_pointer->clock_def("");
  }